

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O1

int __kmp_api_omp_get_max_active_levels_(void)

{
  int iVar1;
  
  iVar1 = __kmp_get_global_thread_id_reg();
  iVar1 = __kmp_get_max_active_levels(iVar1);
  return iVar1;
}

Assistant:

int FTN_STDCALL KMP_EXPAND_NAME(FTN_GET_MAX_ACTIVE_LEVELS)(void) {
#ifdef KMP_STUB
  return 0;
#else
  /* TO DO: We want per-task implementation of this internal control */
  return __kmp_get_max_active_levels(__kmp_entry_gtid());
#endif
}